

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O0

color_quad_u8
crnlib::dxt1_block::unpack_endpoint(uint32 endpoints,uint index,bool scaled,uint alpha)

{
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 in_EDI;
  uint in_stack_00000008;
  bool in_stack_0000000d;
  uint16 in_stack_0000000e;
  
  unpack_color(in_stack_0000000e,in_stack_0000000d,in_stack_00000008);
  return (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)in_EDI.field_0;
}

Assistant:

color_quad_u8 dxt1_block::unpack_endpoint(uint32 endpoints, uint index, bool scaled, uint alpha) {
  CRNLIB_ASSERT(index < 2);
  return unpack_color(static_cast<uint16>((endpoints >> (index * 16U)) & 0xFFFFU), scaled, alpha);
}